

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall date_parse_result::def_date(date_parse_result *this,int32_t dayno)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint *in_RCX;
  int extraout_EDX;
  uint in_ESI;
  void *pvVar4;
  date_parse_result *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_ffffffffffffffdc;
  date_parse_result *in_stack_ffffffffffffffe0;
  
  (*in_RDI->cal->_vptr_multicaldate_t[3])(in_RDI->cal,(ulong)in_ESI);
  if ((in_RDI->era != 0) && (iVar1 = has_year(in_RDI), iVar1 != 0)) {
    in_stack_ffffffffffffffe0 = (date_parse_result *)(ulong)(in_RDI->era + 2);
    in_RCX = &switchD_002f5148::switchdataD_00384ee8;
    switch(in_stack_ffffffffffffffe0) {
    case (date_parse_result *)0x0:
      uVar2 = 1 - in_RDI->yy;
      in_RCX = (uint *)(ulong)uVar2;
      in_RDI->yy = uVar2;
      in_RDI->yy_needs_century = 0;
      break;
    case (date_parse_result *)0x1:
      in_RCX = (uint *)(ulong)(uint)-in_RDI->yy;
      in_RDI->yy = -in_RDI->yy;
      break;
    case (date_parse_result *)0x3:
      break;
    case (date_parse_result *)0x4:
      in_RDI->yy_needs_century = 0;
    }
  }
  uVar2 = multicaldate_t::y(in_RDI->cal);
  pvVar4 = (void *)(ulong)uVar2;
  def_year(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  multicaldate_t::m(in_RDI->cal,pvVar4,extraout_EDX,(char *)in_RCX,in_R8D,in_R9D);
  def_month(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  multicaldate_t::d(in_RDI->cal);
  def_day(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (in_RDI->yy_needs_century != 0) {
    iVar1 = multicaldate_t::y(in_RDI->cal);
    in_RDI->yy = (iVar1 / 100) * 100 + in_RDI->yy;
    iVar1 = in_RDI->yy;
    iVar3 = multicaldate_t::y(in_RDI->cal);
    if (iVar1 < iVar3 + -0x32) {
      in_RDI->yy = in_RDI->yy + 100;
    }
    iVar1 = in_RDI->yy;
    iVar3 = multicaldate_t::y(in_RDI->cal);
    if (iVar3 + 0x31 < iVar1) {
      in_RDI->yy = in_RDI->yy + -100;
    }
  }
  return;
}

Assistant:

void def_date(int32_t dayno)
    {
        /* convert the day number to a calendar date */
        cal->set_dayno(dayno);

        /* apply the era to the year, if both are present */
        if (era != 0 && has_year())
        {
            switch (era)
            {
            case 1:
                /* 
                 *   astronomical '+' notation - the internal year number
                 *   matches the nominal year 
                 */
                break;
                
            case 2:
                /* 
                 *   AD - the internal year matches the nominal year, but an
                 *   explicit AD overrides the need for a century; e.g., AD
                 *   87 is pretty clear that we're talking about an
                 *   historical date in the first century 
                 */
                yy_needs_century = FALSE;
                break;
                
            case -1:
                /* 
                 *   astronomical '-' notation - the internal year number
                 *   matches the nominal negative year number, since we use
                 *   the same notation internally
                 */
                yy = -yy;
                break;
                
            case -2:
                /* BC - 1 BC is internal year 0, 2 BC is year -1, etc */
                yy = -yy + 1;
                yy_needs_century = FALSE;
                break;
            }
        }

        /* set the default year, month, and day from the given date */
        def_year(cal->y());
        def_month(cal->m());
        def_day(cal->d());

        /* 
         *   If the year was specified without a century, choose the century
         *   such that it yields the year nearest to the current year.  This
         *   is equivalent to finding the year within 50 years of the current
         *   year.  For 2012, this makes the range 1962 to 2061 - so '62 is
         *   taken to be 1962, '85 is 1985, but '15 is 2015, and 61 is 2061.
         */
        if (yy_needs_century)
        {
            yy += ((cal->y() / 100) * 100);
            if (yy < cal->y() - 50)
                yy += 100;
            if (yy > cal->y() + 49)
                yy -= 100;
        }
    }